

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::GridDataType1::Encode(GridDataType1 *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  reference puVar3;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  GridDataType1 *this_local;
  
  GridData::Encode(&this->super_GridData,stream);
  pKVar2 = KDataStream::operator<<(stream,*(float *)&(this->super_GridData).field_0xc);
  pKVar2 = KDataStream::operator<<(pKVar2,(float)this->m_f32FieldOffset);
  KDataStream::operator<<(pKVar2,this->m_ui16NumValues);
  citrEnd = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                      (&this->m_vui16Values);
  local_28._M_current =
       (unsigned_short *)
       std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(&this->m_vui16Values);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&citrEnd);
    KDataStream::operator<<(stream,*puVar3);
    __gnu_cxx::
    __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&citrEnd);
  }
  if ((uint)this->m_ui16NumValues % 2 == 1) {
    KDataStream::operator<<(stream,this->m_ui16Padding);
  }
  return;
}

Assistant:

void GridDataType1::Encode( KDataStream & stream ) const
{
    GridData::Encode( stream );

    stream << m_f32FieldScale
           << m_f32FieldOffset
           << m_ui16NumValues;

    vector<KUINT16>::const_iterator citr = m_vui16Values.begin();
    vector<KUINT16>::const_iterator citrEnd = m_vui16Values.end();
    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }

    // Should we add some padding onto the end? We need to have a 32 bit alignment.
    if( m_ui16NumValues % 2 == 1 )
    {
        stream << m_ui16Padding;
    }
}